

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sasl_mechanism.c
# Opt level: O3

SASL_MECHANISM_HANDLE
saslmechanism_create
          (SASL_MECHANISM_INTERFACE_DESCRIPTION *sasl_mechanism_interface_description,
          void *sasl_mechanism_create_parameters)

{
  SASL_MECHANISM_CREATE p_Var1;
  SASL_MECHANISM_HANDLE __ptr;
  CONCRETE_SASL_MECHANISM_HANDLE pvVar2;
  LOGGER_LOG p_Var3;
  int iVar4;
  char *pcVar5;
  
  if (sasl_mechanism_interface_description == (SASL_MECHANISM_INTERFACE_DESCRIPTION *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      pcVar5 = "NULL sasl_mechanism_interface_description";
      iVar4 = 0x17;
LAB_00156a6a:
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/sasl_mechanism.c"
                ,"saslmechanism_create",iVar4,1,pcVar5);
      return (SASL_MECHANISM_HANDLE)0x0;
    }
  }
  else {
    p_Var1 = sasl_mechanism_interface_description->concrete_sasl_mechanism_create;
    if ((((p_Var1 == (SASL_MECHANISM_CREATE)0x0) ||
         (sasl_mechanism_interface_description->concrete_sasl_mechanism_destroy ==
          (SASL_MECHANISM_DESTROY)0x0)) ||
        (sasl_mechanism_interface_description->concrete_sasl_mechanism_get_init_bytes ==
         (SASL_MECHANISM_GET_INIT_BYTES)0x0)) ||
       (sasl_mechanism_interface_description->concrete_sasl_mechanism_get_mechanism_name ==
        (SASL_MECHANISM_GET_MECHANISM_NAME)0x0)) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        pcVar5 = 
        "Bad interface, concrete_sasl_mechanism_create = %p, concrete_sasl_mechanism_destroy = %p, concrete_sasl_mechanism_get_init_bytes = %p, concrete_sasl_mechanism_get_mechanism_name = %p"
        ;
        iVar4 = 0x24;
        goto LAB_00156a6a;
      }
    }
    else {
      __ptr = (SASL_MECHANISM_HANDLE)malloc(0x10);
      if (__ptr == (SASL_MECHANISM_HANDLE)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          pcVar5 = "Could not allocate memory for SASL mechanism";
          iVar4 = 0x2d;
          goto LAB_00156a6a;
        }
      }
      else {
        __ptr->sasl_mechanism_interface_description = sasl_mechanism_interface_description;
        pvVar2 = (*p_Var1)(sasl_mechanism_create_parameters);
        __ptr->concrete_sasl_mechanism_handle = pvVar2;
        if (pvVar2 != (CONCRETE_SASL_MECHANISM_HANDLE)0x0) {
          return __ptr;
        }
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/sasl_mechanism.c"
                    ,"saslmechanism_create",0x38,1,"concrete_sasl_mechanism_create failed");
        }
        free(__ptr);
      }
    }
  }
  return (SASL_MECHANISM_HANDLE)0x0;
}

Assistant:

SASL_MECHANISM_HANDLE saslmechanism_create(const SASL_MECHANISM_INTERFACE_DESCRIPTION* sasl_mechanism_interface_description, void* sasl_mechanism_create_parameters)
{
    SASL_MECHANISM_HANDLE result;

    /* Codes_SRS_SASL_MECHANISM_01_004: [If the argument `sasl_mechanism_interface_description` is NULL, `saslmechanism_create` shall return NULL.] */
    if (sasl_mechanism_interface_description == NULL)
    {
        LogError("NULL sasl_mechanism_interface_description");
        result = NULL;
    }
    /* Codes_SRS_SASL_MECHANISM_01_005: [If any `sasl_mechanism_interface_description` member is NULL, `saslmechanism_create` shall fail and return NULL.] */
    else if ((sasl_mechanism_interface_description->concrete_sasl_mechanism_create == NULL) ||
        (sasl_mechanism_interface_description->concrete_sasl_mechanism_destroy == NULL) ||
        (sasl_mechanism_interface_description->concrete_sasl_mechanism_get_init_bytes == NULL) ||
        (sasl_mechanism_interface_description->concrete_sasl_mechanism_get_mechanism_name == NULL))
    {
        LogError("Bad interface, concrete_sasl_mechanism_create = %p, concrete_sasl_mechanism_destroy = %p, concrete_sasl_mechanism_get_init_bytes = %p, concrete_sasl_mechanism_get_mechanism_name = %p",
            sasl_mechanism_interface_description->concrete_sasl_mechanism_create,
            sasl_mechanism_interface_description->concrete_sasl_mechanism_destroy,
            sasl_mechanism_interface_description->concrete_sasl_mechanism_get_init_bytes,
            sasl_mechanism_interface_description->concrete_sasl_mechanism_get_mechanism_name);
        result = NULL;
    }
    else
    {
        result = (SASL_MECHANISM_HANDLE)malloc(sizeof(SASL_MECHANISM_INSTANCE));
        if (result == NULL)
        {
            /* Codes_SRS_SASL_MECHANISM_01_006: [If allocating the memory needed for the SASL mechanism interface fails then `saslmechanism_create` shall fail and return NULL.] */
            LogError("Could not allocate memory for SASL mechanism");
        }
        else
        {
            result->sasl_mechanism_interface_description = sasl_mechanism_interface_description;

            /* Codes_SRS_SASL_MECHANISM_01_002: [In order to instantiate the concrete SASL mechanism implementation the function `concrete_sasl_mechanism_create` from the `sasl_mechanism_interface_description` shall be called, passing the `sasl_mechanism_create_parameters` to it.] */
            result->concrete_sasl_mechanism_handle = result->sasl_mechanism_interface_description->concrete_sasl_mechanism_create((void*)sasl_mechanism_create_parameters);
            if (result->concrete_sasl_mechanism_handle == NULL)
            {
                /* Codes_SRS_SASL_MECHANISM_01_003: [If the underlying `concrete_sasl_mechanism_create` call fails, `saslmechanism_create` shall return NULL.] */
                LogError("concrete_sasl_mechanism_create failed");
                free(result);
                result = NULL;
            }
        }
    }

    /* Codes_SRS_SASL_MECHANISM_01_001: [`saslmechanism_create` shall return on success a non-NULL handle to a new SASL mechanism interface.] */
    return result;
}